

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O2

try_update_result_type __thiscall
unodb::
olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
::try_insert(olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
             *this,art_key_type k,value_type v,olc_db_leaf_unique_ptr_type *cached_leaf)

{
  version_type *this_00;
  long *plVar1;
  undefined1 *puVar2;
  array<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>,_4UL>
  *paVar3;
  long lVar4;
  basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>
  *ptr_;
  value_view v_00;
  value_view v_01;
  basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_> k_00;
  basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_> k_01;
  basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_> shifted_key;
  _Tuple_impl<1UL,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  ptr__00;
  _Head_base<0UL,_unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_*,_false>
  _Var5;
  pointer ptr__01;
  bool bVar6;
  byte bVar7;
  uint uVar8;
  int iVar9;
  _Storage<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*,_true>
  _Var10;
  uintptr_t uVar11;
  ushort uVar12;
  basic_inode_impl<unodb::detail::basic_art_policy<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>,unodb::olc_db,unodb::in_critical_section,unodb::optimistic_lock,unodb::optimistic_lock::read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,unodb::detail::olc_inode_defs,unodb::detail::db_inode_qsbr_deleter,unodb::detail::db_leaf_qsbr_deleter>>
  *this_01;
  ulong uVar13;
  ushort uVar14;
  optional<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*>
  oVar15;
  undefined1 local_e0 [8];
  value_type v_local;
  basic_node_ptr<unodb::detail::olc_node_header> node;
  art_key_type k_local;
  in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
  *node_in_parent;
  db_inode_unique_ptr<unodb::detail::olc_inode_4<std::span<const_std::byte>,_std::span<const_std::byte>_>_>
  new_node;
  undefined1 auStack_98 [8];
  art_key_type remaining_key;
  write_guard local_80;
  uint shared_prefix_length;
  undefined1 local_70 [8];
  key_view existing_key;
  read_critical_section node_critical_section;
  read_critical_section parent_critical_section;
  write_guard parent_guard;
  tree_depth_type depth;
  
  v_local._M_ptr = (pointer)v._M_extent._M_extent_value;
  local_e0 = (undefined1  [8])v._M_ptr;
  k_local.field_0.key._M_ptr = (pointer)k.field_0._8_8_;
  node.tagged_ptr = k.field_0._0_8_;
  optimistic_lock::try_read_lock((optimistic_lock *)&node_critical_section.version);
  if (node_critical_section.version.version == 0) {
    uVar14 = 0;
    uVar12 = 0;
  }
  else {
    uVar13 = (this->root).value._M_i.tagged_ptr;
    v_local._M_extent._M_extent_value = uVar13;
    new_node._M_t.
    super___uniq_ptr_impl<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_*,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
    .
    super__Head_base<0UL,_unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_*,_false>
    ._M_head_impl =
         (olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
          *)this;
    _shared_prefix_length =
         (__uniq_ptr_impl<unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
          *)cached_leaf;
    if (uVar13 == 0) {
      detail::
      create_leaf_if_needed<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>
                (cached_leaf,
                 (basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>)k.field_0,v,
                 this);
      auStack_98 = (undefined1  [8])
                   optimistic_lock::write_guard::try_lock_upgrade
                             ((read_critical_section *)&node_critical_section.version);
      if (auStack_98 == (undefined1  [8])0x0) {
        uVar12 = 0;
      }
      else {
        ptr_ = (cached_leaf->_M_t).
               super___uniq_ptr_impl<unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>_*,_unodb::detail::basic_db_leaf_deleter<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
               .
               super__Head_base<0UL,_unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>_*,_false>
               ._M_head_impl;
        (cached_leaf->_M_t).
        super___uniq_ptr_impl<unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>_*,_unodb::detail::basic_db_leaf_deleter<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
        .
        super__Head_base<0UL,_unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>_*,_false>
        ._M_head_impl =
             (basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>
              *)0x0;
        uVar11 = detail::basic_node_ptr<unodb::detail::olc_node_header>::tag_ptr
                           (&ptr_->super_olc_node_header,LEAF);
        (this->root).value._M_i.tagged_ptr = uVar11;
        uVar12 = 0x100;
      }
      optimistic_lock::write_guard::~write_guard((write_guard *)auStack_98);
LAB_0016f5f8:
      uVar14 = 1;
    }
    else {
      parent_guard.lock._4_4_ = 0;
      auStack_98 = (undefined1  [8])node.tagged_ptr;
      remaining_key.field_0.key._M_ptr = k_local.field_0.key._M_ptr;
      this_00 = &node_critical_section.version;
      k_local.field_0.key._M_extent._M_extent_value =
           (__extent_storage<18446744073709551615UL>)&this->root;
      bVar6 = optimistic_lock::read_critical_section::check((read_critical_section *)this_00);
      if (bVar6) {
        do {
          this_01 = (basic_inode_impl<unodb::detail::basic_art_policy<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>,unodb::olc_db,unodb::in_critical_section,unodb::optimistic_lock,unodb::optimistic_lock::read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,unodb::detail::olc_inode_defs,unodb::detail::db_inode_qsbr_deleter,unodb::detail::db_leaf_qsbr_deleter>>
                     *)(uVar13 & 0xfffffffffffffff8);
          optimistic_lock::try_read_lock((optimistic_lock *)&existing_key._M_extent);
          if (existing_key._M_extent._M_extent_value == 0) goto LAB_0016f7e2;
          if ((uVar13 & 7) == 0) {
            local_70 = (undefined1  [8])(this_01 + 0x20);
            existing_key._M_ptr = (pointer)(ulong)*(uint *)(this_01 + 0x18);
            iVar9 = detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>::cmp
                              ((basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_> *
                               )&node,(void *)local_70,existing_key._M_ptr);
            _Var5 = new_node._M_t.
                    super___uniq_ptr_impl<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_*,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                    .
                    super__Head_base<0UL,_unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_*,_false>
            ;
            if (iVar9 == 0) {
              if (*(long *)(node_critical_section.version.version + 8) < 1) {
LAB_0016f787:
                __assert_fail("read_lock_count.load(std::memory_order_acquire) > 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                              ,0x2f6,"bool unodb::optimistic_lock::check(version_type) const");
              }
              if (parent_critical_section.lock ==
                  *(optimistic_lock **)node_critical_section.version.version) {
                LOCK();
                plVar1 = (long *)(node_critical_section.version.version + 8);
                lVar4 = *plVar1;
                *plVar1 = *plVar1 + -1;
                UNLOCK();
                if (SBORROW8(lVar4,1) != *plVar1 < 0) {
LAB_0016f7a6:
                  __assert_fail("old_value > 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                                ,0x343,"void unodb::optimistic_lock::dec_read_lock_count() const");
                }
                node_critical_section.version.version = 0;
                if (*(long *)(existing_key._M_extent._M_extent_value + 8) < 1) goto LAB_0016f787;
                if (node_critical_section.lock !=
                    *(optimistic_lock **)existing_key._M_extent._M_extent_value) {
                  optimistic_lock::dec_read_lock_count
                            ((optimistic_lock *)existing_key._M_extent._M_extent_value);
                  existing_key._M_extent._M_extent_value = 0;
                  goto LAB_0016f7e2;
                }
                LOCK();
                plVar1 = (long *)(existing_key._M_extent._M_extent_value + 8);
                lVar4 = *plVar1;
                *plVar1 = *plVar1 + -1;
                UNLOCK();
                if (SBORROW8(lVar4,1) != *plVar1 < 0) goto LAB_0016f7a6;
                existing_key._M_extent._M_extent_value = 0;
                uVar12 = 0x100;
                if ((_shared_prefix_length->_M_t).
                    super__Tuple_impl<0UL,_unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>_*,_unodb::detail::basic_db_leaf_deleter<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                    .
                    super__Head_base<0UL,_unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>_*,_false>
                    ._M_head_impl ==
                    (basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>
                     *)0x0) {
                  uVar14 = 0;
                }
                else {
                  uVar14 = 0;
                  std::
                  __uniq_ptr_impl<unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                  ::reset(_shared_prefix_length,(pointer)0x0);
                }
              }
              else {
                optimistic_lock::dec_read_lock_count
                          ((optimistic_lock *)node_critical_section.version.version);
                node_critical_section.version.version = 0;
LAB_0016f7e2:
                uVar14 = 0;
                uVar12 = 0;
              }
            }
            else {
              k_00.field_0.key._M_extent._M_extent_value =
                   (__extent_storage<18446744073709551615UL>)
                   (__extent_storage<18446744073709551615UL>)k_local.field_0.key._M_ptr;
              k_00.field_0.key._M_ptr = (pointer)node.tagged_ptr;
              v_00._M_extent._M_extent_value = (size_t)v_local._M_ptr;
              v_00._M_ptr = (pointer)local_e0;
              detail::
              create_leaf_if_needed<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>
                        ((olc_db_leaf_unique_ptr<std::span<const_std::byte>,_std::span<const_std::byte>_>
                          *)_shared_prefix_length,k_00,v_00,
                         (olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
                          *)new_node._M_t.
                            super___uniq_ptr_impl<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_*,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                            .
                            super__Head_base<0UL,_unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_*,_false>
                            ._M_head_impl);
              detail::
              basic_art_policy<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>,unodb::olc_db,unodb::in_critical_section,unodb::optimistic_lock,unodb::optimistic_lock::read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,unodb::detail::olc_inode_defs,unodb::detail::db_inode_qsbr_deleter,unodb::detail::db_leaf_qsbr_deleter>
              ::
              make_db_inode_unique_ptr<unodb::detail::olc_inode_4<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>,std::span<std::byte_const,18446744073709551615ul>const&,unodb::detail::basic_art_key<std::span<std::byte_const,18446744073709551615ul>>&,unodb::detail::tree_depth<unodb::detail::basic_art_key<std::span<std::byte_const,18446744073709551615ul>>>&>
                        ((basic_art_policy<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>,unodb::olc_db,unodb::in_critical_section,unodb::optimistic_lock,unodb::optimistic_lock::read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,unodb::detail::olc_inode_defs,unodb::detail::db_inode_qsbr_deleter,unodb::detail::db_leaf_qsbr_deleter>
                          *)&node_in_parent,(db_type *)_Var5._M_head_impl,
                         (span<const_std::byte,_18446744073709551615UL> *)local_70,
                         (basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_> *)
                         auStack_98,
                         (tree_depth<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>_>
                          *)((long)&parent_guard.lock + 4));
              parent_critical_section.version.version =
                   (version_tag_type)
                   optimistic_lock::write_guard::try_lock_upgrade
                             ((read_critical_section *)&node_critical_section.version);
              if ((optimistic_lock *)parent_critical_section.version.version ==
                  (optimistic_lock *)0x0) {
LAB_0016f73a:
                optimistic_lock::write_guard::~write_guard
                          ((write_guard *)&parent_critical_section.version);
                uVar12 = 0;
              }
              else {
                local_80.lock =
                     optimistic_lock::write_guard::try_lock_upgrade
                               ((read_critical_section *)&existing_key._M_extent);
                if (local_80.lock == (optimistic_lock *)0x0) {
                  optimistic_lock::write_guard::~write_guard(&local_80);
                  goto LAB_0016f73a;
                }
                detail::
                olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
                ::init((olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
                        *)new_node._M_t.
                          super___uniq_ptr_impl<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_*,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                          .
                          super__Tuple_impl<1UL,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                          .
                          super__Head_base<1UL,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_false>
                          ._M_head_impl.db,(EVP_PKEY_CTX *)local_70);
                ptr__00 = new_node._M_t.
                          super___uniq_ptr_impl<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_*,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                          .
                          super__Tuple_impl<1UL,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                ;
                new_node._M_t.
                super___uniq_ptr_impl<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_*,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                .
                super__Tuple_impl<1UL,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                .
                super__Head_base<1UL,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_false>
                ._M_head_impl.db =
                     (_Head_base<1UL,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_false>
                      )(basic_db_inode_deleter<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                        )0x0;
                uVar11 = detail::basic_node_ptr<unodb::detail::olc_node_header>::tag_ptr
                                   ((olc_node_header *)
                                    ptr__00.
                                    super__Head_base<1UL,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_false>
                                    ._M_head_impl.db,I4);
                *(uintptr_t *)k_local.field_0.key._M_extent._M_extent_value = uVar11;
                optimistic_lock::write_guard::~write_guard(&local_80);
                optimistic_lock::write_guard::~write_guard
                          ((write_guard *)&parent_critical_section.version);
                LOCK();
                puVar2 = &_Var5._M_head_impl[7].
                          super_olc_inode_4_parent<std::span<const_std::byte>,_std::span<const_std::byte>_>
                          .field_0x8;
                *(long *)puVar2 = *(long *)puVar2 + 1;
                UNLOCK();
                uVar12 = 0x100;
              }
              std::
              unique_ptr<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
              ::~unique_ptr((unique_ptr<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                             *)&node_in_parent);
              uVar14 = 1;
            }
            optimistic_lock::read_critical_section::~read_critical_section
                      ((read_critical_section *)&existing_key._M_extent);
            goto LAB_0016f606;
          }
          bVar7 = detail::
                  key_prefix<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>::critical_section_policy>
                  ::length((key_prefix<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>::critical_section_policy>
                            *)(this_01 + 0x18));
          shifted_key.field_0.key._M_extent._M_extent_value =
               (__extent_storage<18446744073709551615UL>)
               (__extent_storage<18446744073709551615UL>)remaining_key.field_0.key._M_ptr;
          shifted_key.field_0.key._M_ptr = (pointer)auStack_98;
          uVar8 = detail::
                  key_prefix<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>::critical_section_policy>
                  ::get_shared_length((key_prefix<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>::critical_section_policy>
                                       *)(this_01 + 0x18),shifted_key);
          _Var5 = new_node._M_t.
                  super___uniq_ptr_impl<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_*,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                  .
                  super__Head_base<0UL,_unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_*,_false>
          ;
          local_80.lock._0_4_ = uVar8;
          if (uVar8 < bVar7) {
            k_01.field_0.key._M_extent._M_extent_value =
                 (__extent_storage<18446744073709551615UL>)
                 (__extent_storage<18446744073709551615UL>)k_local.field_0.key._M_ptr;
            k_01.field_0.key._M_ptr = (pointer)node.tagged_ptr;
            v_01._M_extent._M_extent_value = (size_t)v_local._M_ptr;
            v_01._M_ptr = (pointer)local_e0;
            detail::
            create_leaf_if_needed<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>
                      ((olc_db_leaf_unique_ptr<std::span<const_std::byte>,_std::span<const_std::byte>_>
                        *)_shared_prefix_length,k_01,v_01,
                       (olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
                        *)new_node._M_t.
                          super___uniq_ptr_impl<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_*,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                          .
                          super__Head_base<0UL,_unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_*,_false>
                          ._M_head_impl);
            detail::
            basic_art_policy<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>,unodb::olc_db,unodb::in_critical_section,unodb::optimistic_lock,unodb::optimistic_lock::read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,unodb::detail::olc_inode_defs,unodb::detail::db_inode_qsbr_deleter,unodb::detail::db_leaf_qsbr_deleter>
            ::
            make_db_inode_unique_ptr<unodb::detail::olc_inode_4<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>,unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>&,unsigned_int_const&>
                      ((basic_art_policy<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>,unodb::olc_db,unodb::in_critical_section,unodb::optimistic_lock,unodb::optimistic_lock::read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,unodb::detail::olc_inode_defs,unodb::detail::db_inode_qsbr_deleter,unodb::detail::db_leaf_qsbr_deleter>
                        *)local_70,(db_type *)_Var5._M_head_impl,
                       (basic_node_ptr<unodb::detail::olc_node_header> *)&v_local._M_extent,
                       (uint *)&local_80);
            node_in_parent =
                 (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                  *)optimistic_lock::write_guard::try_lock_upgrade
                              ((read_critical_section *)&node_critical_section.version);
            if ((optimistic_lock *)node_in_parent == (optimistic_lock *)0x0) {
LAB_0016f755:
              optimistic_lock::write_guard::~write_guard((write_guard *)&node_in_parent);
              uVar12 = 0;
            }
            else {
              parent_critical_section.version.version =
                   (version_tag_type)
                   optimistic_lock::write_guard::try_lock_upgrade
                             ((read_critical_section *)&existing_key._M_extent);
              if ((optimistic_lock *)parent_critical_section.version.version ==
                  (optimistic_lock *)0x0) {
                optimistic_lock::write_guard::~write_guard
                          ((write_guard *)&parent_critical_section.version);
                goto LAB_0016f755;
              }
              detail::
              olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
              ::init((olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
                      *)existing_key._M_ptr,(EVP_PKEY_CTX *)v_local._M_extent._M_extent_value);
              ptr__01 = existing_key._M_ptr;
              existing_key._M_ptr = (pointer)0x0;
              uVar11 = detail::basic_node_ptr<unodb::detail::olc_node_header>::tag_ptr
                                 ((olc_node_header *)ptr__01,I4);
              *(uintptr_t *)k_local.field_0.key._M_extent._M_extent_value = uVar11;
              optimistic_lock::write_guard::~write_guard
                        ((write_guard *)&parent_critical_section.version);
              optimistic_lock::write_guard::~write_guard((write_guard *)&node_in_parent);
              LOCK();
              puVar2 = &_Var5._M_head_impl[7].
                        super_olc_inode_4_parent<std::span<const_std::byte>,_std::span<const_std::byte>_>
                        .field_0x8;
              *(long *)puVar2 = *(long *)puVar2 + 1;
              UNLOCK();
              LOCK();
              paVar3 = &_Var5._M_head_impl[3].
                        super_olc_inode_4_parent<std::span<const_std::byte>,_std::span<const_std::byte>_>
                        .children;
              paVar3->_M_elems[0].value._M_i.tagged_ptr =
                   paVar3->_M_elems[0].value._M_i.tagged_ptr + 1;
              UNLOCK();
              uVar12 = 0x100;
            }
            std::
            unique_ptr<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
            ::~unique_ptr((unique_ptr<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                           *)local_70);
LAB_0016f5ef:
            optimistic_lock::read_critical_section::~read_critical_section
                      ((read_critical_section *)&existing_key._M_extent);
            goto LAB_0016f5f8;
          }
          if (uVar8 != bVar7) {
            __assert_fail("shared_prefix_length == key_prefix_length",
                          "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                          ,0x76f,
                          "typename olc_db<Key, Value>::try_update_result_type unodb::olc_db<std::span<const std::byte>, std::span<const std::byte>>::try_insert(art_key_type, value_type, olc_db_leaf_unique_ptr_type &) [Key = std::span<const std::byte>, Value = std::span<const std::byte>]"
                         );
          }
          parent_guard.lock._4_4_ = parent_guard.lock._4_4_ + uVar8;
          detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>::shift_right
                    ((basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_> *)
                     auStack_98,(ulong)bVar7);
          local_70[0] = *(byte *)auStack_98;
          oVar15 = detail::
                   basic_inode_impl<unodb::detail::basic_art_policy<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>,unodb::olc_db,unodb::in_critical_section,unodb::optimistic_lock,unodb::optimistic_lock::read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,unodb::detail::olc_inode_defs,unodb::detail::db_inode_qsbr_deleter,unodb::detail::db_leaf_qsbr_deleter>>
                   ::
                   add_or_choose_subtree<std::optional<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>>*>,std::byte,unodb::detail::basic_art_key<std::span<std::byte_const,18446744073709551615ul>>&,std::span<std::byte_const,18446744073709551615ul>&,unodb::olc_db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>&,unodb::detail::tree_depth<unodb::detail::basic_art_key<std::span<std::byte_const,18446744073709551615ul>>>&,unodb::optimistic_lock::read_critical_section&,unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>>*&,unodb::optimistic_lock::read_critical_section&,std::unique_ptr<unodb::detail::basic_leaf<std::span<std::byte_const,18446744073709551615ul>,unodb::detail::olc_node_header>,unodb::detail::basic_db_leaf_deleter<unodb::olc_db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>>>&>
                             (this_01,(node_type)uVar13 & (I256|I48),local_70,
                              (basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_> *)
                              &node,(span<const_std::byte,_18446744073709551615UL> *)local_e0,
                              (olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
                               *)new_node._M_t.
                                 super___uniq_ptr_impl<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_*,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                                 .
                                 super__Head_base<0UL,_unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_*,_false>
                                 ._M_head_impl,
                              (tree_depth<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>_>
                               *)((long)&parent_guard.lock + 4),
                              (read_critical_section *)&existing_key._M_extent,
                              (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                               **)&k_local.field_0.key._M_extent,(read_critical_section *)this_00,
                              (unique_ptr<unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                               *)_shared_prefix_length);
          _Var10 = oVar15.
                   super__Optional_base<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*,_true,_true>
                   ._M_payload.
                   super__Optional_payload_base<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*>
                   ._M_payload;
          if (((undefined1  [16])
               oVar15.
               super__Optional_base<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*,_true,_true>
               ._M_payload.
               super__Optional_payload_base<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*>
              & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
LAB_0016f634:
            uVar12 = 0;
            goto LAB_0016f5ef;
          }
          if (_Var10._M_value ==
              (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_> *
              )0x0) {
            uVar12 = 0x100;
            goto LAB_0016f5ef;
          }
          if (*(long *)(node_critical_section.version.version + 8) < 1) goto LAB_0016f787;
          if (parent_critical_section.lock !=
              *(optimistic_lock **)node_critical_section.version.version) {
            optimistic_lock::dec_read_lock_count
                      ((optimistic_lock *)node_critical_section.version.version);
            node_critical_section.version.version = 0;
            goto LAB_0016f634;
          }
          LOCK();
          plVar1 = (long *)(node_critical_section.version.version + 8);
          lVar4 = *plVar1;
          *plVar1 = *plVar1 + -1;
          UNLOCK();
          if (SBORROW8(lVar4,1) != *plVar1 < 0) goto LAB_0016f7a6;
          uVar13 = ((_Var10._M_value)->value)._M_i.tagged_ptr;
          node_critical_section.version.version = existing_key._M_extent._M_extent_value;
          parent_critical_section.lock = node_critical_section.lock;
          existing_key._M_extent._M_extent_value = 0;
          parent_guard.lock._4_4_ = parent_guard.lock._4_4_ + 1;
          v_local._M_extent._M_extent_value = uVar13;
          k_local.field_0.key._M_extent._M_extent_value =
               (__extent_storage<18446744073709551615UL>)_Var10;
          detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>::shift_right
                    ((basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_> *)
                     auStack_98,1);
          bVar6 = optimistic_lock::read_critical_section::check((read_critical_section *)this_00);
          optimistic_lock::read_critical_section::~read_critical_section
                    ((read_critical_section *)&existing_key._M_extent);
        } while (bVar6);
      }
      uVar14 = 0;
      uVar12 = 0;
    }
  }
LAB_0016f606:
  optimistic_lock::read_critical_section::~read_critical_section
            ((read_critical_section *)&node_critical_section.version);
  return (_Optional_base<bool,_true,_true>)(_Optional_base<bool,_true,_true>)(uVar12 | uVar14);
}

Assistant:

typename olc_db<Key, Value>::try_update_result_type
olc_db<Key, Value>::try_insert(art_key_type k, value_type v,
                               olc_db_leaf_unique_ptr_type& cached_leaf) {
  auto parent_critical_section = root_pointer_lock.try_read_lock();
  if (UNODB_DETAIL_UNLIKELY(parent_critical_section.must_restart())) {
    // LCOV_EXCL_START
    spin_wait_loop_body();
    return {};
    // LCOV_EXCL_STOP
  }

  auto node{root.load()};

  if (UNODB_DETAIL_UNLIKELY(node == nullptr)) {
    create_leaf_if_needed(cached_leaf, k, v, *this);

    const optimistic_lock::write_guard write_unlock_on_exit{
        std::move(parent_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(write_unlock_on_exit.must_restart())) {
      // Do not call spin_wait_loop_body here - creating the leaf took some time
      return {};  // LCOV_EXCL_LINE
    }

    root = detail::olc_node_ptr{cached_leaf.release(), node_type::LEAF};
    return true;
  }

  auto* node_in_parent{&root};
  tree_depth_type depth{};
  auto remaining_key{k};

  if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.check())) {
    // LCOV_EXCL_START
    spin_wait_loop_body();
    return {};
    // LCOV_EXCL_STOP
  }

  while (true) {
    auto node_critical_section = node_ptr_lock(node).try_read_lock();
    if (UNODB_DETAIL_UNLIKELY(node_critical_section.must_restart())) return {};

    const auto node_type = node.type();

    if (node_type == node_type::LEAF) {
      const auto* const leaf{node.template ptr<leaf_type*>()};
      const auto existing_key{leaf->get_key_view()};
      if (UNODB_DETAIL_UNLIKELY(k.cmp(existing_key) == 0)) {
        if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.try_read_unlock()))
          return {};  // LCOV_EXCL_LINE
        if (UNODB_DETAIL_UNLIKELY(!node_critical_section.try_read_unlock()))
          return {};  // LCOV_EXCL_LINE

        if (UNODB_DETAIL_UNLIKELY(cached_leaf != nullptr)) {
          cached_leaf.reset();  // LCOV_EXCL_LINE
        }
        return false;  // exists
      }

      create_leaf_if_needed(cached_leaf, k, v, *this);
      auto new_node{inode_4::create(*this, existing_key, remaining_key, depth)};

      {
        const optimistic_lock::write_guard parent_guard{
            std::move(parent_critical_section)};
        if (UNODB_DETAIL_UNLIKELY(parent_guard.must_restart())) return {};

        const optimistic_lock::write_guard node_guard{
            std::move(node_critical_section)};
        if (UNODB_DETAIL_UNLIKELY(node_guard.must_restart())) return {};

        new_node->init(existing_key, remaining_key, depth, leaf,
                       std::move(cached_leaf));
        *node_in_parent =
            detail::olc_node_ptr{new_node.release(), node_type::I4};
      }
#ifdef UNODB_DETAIL_WITH_STATS
      account_growing_inode<node_type::I4>();
#endif  // UNODB_DETAIL_WITH_STATS
      return true;
    }

    UNODB_DETAIL_ASSERT(node_type != node_type::LEAF);

    auto* const inode{node.template ptr<inode_type*>()};
    const auto& key_prefix{inode->get_key_prefix()};
    const auto key_prefix_length{key_prefix.length()};
    const auto shared_prefix_length{
        key_prefix.get_shared_length(remaining_key)};

    if (shared_prefix_length < key_prefix_length) {
      create_leaf_if_needed(cached_leaf, k, v, *this);
      auto new_node{inode_4::create(*this, node, shared_prefix_length)};

      {
        const optimistic_lock::write_guard parent_guard{
            std::move(parent_critical_section)};
        if (UNODB_DETAIL_UNLIKELY(parent_guard.must_restart())) return {};

        const optimistic_lock::write_guard node_guard{
            std::move(node_critical_section)};
        if (UNODB_DETAIL_UNLIKELY(node_guard.must_restart())) return {};

        new_node->init(node, shared_prefix_length, depth,
                       std::move(cached_leaf));
        *node_in_parent =
            detail::olc_node_ptr{new_node.release(), node_type::I4};
      }

#ifdef UNODB_DETAIL_WITH_STATS
      account_growing_inode<node_type::I4>();
      key_prefix_splits.fetch_add(1, std::memory_order_relaxed);
#endif  // UNODB_DETAIL_WITH_STATS

      return true;
    }

    UNODB_DETAIL_ASSERT(shared_prefix_length == key_prefix_length);

    depth += key_prefix_length;
    remaining_key.shift_right(key_prefix_length);

    const auto add_result{inode->template add_or_choose_subtree<
        std::optional<in_critical_section<detail::olc_node_ptr>*>>(
        node_type, remaining_key[0], k, v, *this, depth, node_critical_section,
        node_in_parent, parent_critical_section, cached_leaf)};

    if (UNODB_DETAIL_UNLIKELY(!add_result)) return {};

    auto* const child_in_parent = *add_result;
    if (child_in_parent == nullptr) return true;

    if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE

    const auto child = child_in_parent->load();

    parent_critical_section = std::move(node_critical_section);
    node = child;
    node_in_parent = child_in_parent;
    ++depth;
    remaining_key.shift_right(1);

    if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.check())) return {};
  }
}